

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

bool __thiscall
TPZMatrix<std::complex<long_double>_>::Compare
          (TPZMatrix<std::complex<long_double>_> *this,TPZSavable *copy,bool override)

{
  long lVar1;
  ostream *poVar2;
  stringstream sout;
  long *local_1c0;
  long local_1b8;
  long local_1b0 [2];
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  if (copy != (TPZSavable *)0x0) {
    lVar1 = __dynamic_cast(copy,&TPZSavable::typeinfo,
                           &TPZMatrix<std::complex<long_double>>::typeinfo,0);
    if (lVar1 == 0) {
      return false;
    }
    if ((((this->super_TPZBaseMatrix).fRow == *(long *)(lVar1 + 8)) &&
        ((this->super_TPZBaseMatrix).fCol == *(long *)(lVar1 + 0x10))) &&
       ((this->super_TPZBaseMatrix).fDecomposed == *(char *)(lVar1 + 0x18))) {
      return true;
    }
    std::__cxx11::stringstream::stringstream(local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_190,
               "virtual bool TPZMatrix<std::complex<long double>>::Compare(TPZSavable *, bool) const [T = std::complex<long double>]"
               ,0x74);
    std::__ostream_insert<char,std::char_traits<char>>(local_190," did not compare ",0x11);
    std::__cxx11::stringbuf::str();
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_1c0,local_1b8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    if (local_1c0 != local_1b0) {
      operator_delete(local_1c0,local_1b0[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_1a0);
    std::ios_base::~ios_base(local_120);
    if (override) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.cpp"
                 ,0x4c5);
    }
  }
  return false;
}

Assistant:

bool TPZMatrix<TVar>::Compare(TPZSavable *copy, bool override) const
{
	TPZMatrix<TVar> *copmat = dynamic_cast<TPZMatrix<TVar> *> (copy);
	if(!copmat) return false;
	bool result = true;
	if(fRow != copmat->fRow || fCol != copmat->fCol || fDecomposed != copmat->fDecomposed) result = false;
	if(!result)
	{
		std::stringstream sout;
		sout << __PRETTY_FUNCTION__ << " did not compare ";
		LOGPZ_ERROR(loggerCheck,sout.str())
	}
	if(override && !result)
	{
		DebugStop();
	}
	return result;
}